

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Vector<kj::MainBuilder::Impl::Arg>::grow
          (Vector<kj::MainBuilder::Impl::Arg> *this,size_t minCapacity)

{
  Arg *pAVar1;
  Arg *pAVar2;
  ulong uVar3;
  
  pAVar1 = (this->builder).endPtr;
  pAVar2 = (this->builder).ptr;
  uVar3 = 4;
  if (pAVar1 != pAVar2) {
    uVar3 = (((long)pAVar1 - (long)pAVar2) / 0x28) * 2;
  }
  if (minCapacity <= uVar3) {
    minCapacity = uVar3;
  }
  setCapacity(this,minCapacity);
  return;
}

Assistant:

inline size_t capacity() const { return endPtr - ptr; }